

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vSupp)

{
  Gia_Obj_t *pGVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar8;
  int iVar9;
  ulong uVar7;
  
  if (-1 < iObj) {
    uVar7 = (ulong)(uint)iObj;
    uVar3 = (ulong)(uint)p->nObjs;
    do {
      iVar5 = (int)uVar7;
      if ((int)uVar3 <= iVar5) break;
      if (p->nTravIdsAlloc <= iVar5) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[uVar7] == p->nTravIds) {
        return;
      }
      pGVar8 = p->pObjs + uVar7;
      p->pTravIds[uVar7] = p->nTravIds;
      uVar6 = (uint)*(undefined8 *)pGVar8;
      if ((~uVar6 & 0x9fffffff) == 0) {
        uVar6 = vSupp->nSize;
        uVar7 = (ulong)uVar6;
        if (uVar6 == vSupp->nCap) {
          if ((int)uVar6 < 0x10) {
            if (vSupp->pArray == (int *)0x0) {
              piVar4 = (int *)malloc(0x40);
            }
            else {
              piVar4 = (int *)realloc(vSupp->pArray,0x40);
            }
            vSupp->pArray = piVar4;
            iVar9 = 0x10;
            if (piVar4 == (int *)0x0) {
LAB_002383d8:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (vSupp->pArray == (int *)0x0) {
              piVar4 = (int *)malloc(uVar7 * 8);
            }
            else {
              piVar4 = (int *)realloc(vSupp->pArray,uVar7 * 8);
            }
            vSupp->pArray = piVar4;
            if (piVar4 == (int *)0x0) goto LAB_002383d8;
            iVar9 = uVar6 * 2;
          }
          vSupp->nCap = iVar9;
          uVar7 = (ulong)(uint)vSupp->nSize;
        }
        else {
          piVar4 = vSupp->pArray;
        }
        vSupp->nSize = (int)uVar7 + 1;
        if ((int)uVar7 < 1) goto LAB_0023836c;
        goto LAB_0023834f;
      }
      if (((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                      ,0x16a,
                      "void Gia_ObjComputeTruth6CisSupport_rec(Gia_Man_t *, int, Vec_Int_t *)");
      }
      if (p->nObjs <= iVar5) {
LAB_0023837b:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Gia_ObjComputeTruth6CisSupport_rec(p,iVar5 - (uVar6 & 0x1fffffff),vSupp);
      pGVar1 = p->pObjs;
      if ((pGVar8 < pGVar1) || (uVar3 = (ulong)p->nObjs, pGVar1 + uVar3 <= pGVar8))
      goto LAB_0023837b;
      uVar6 = (int)((ulong)((long)pGVar8 - (long)pGVar1) >> 2) * -0x55555555 -
              (*(uint *)&pGVar8->field_0x4 & 0x1fffffff);
      uVar7 = (ulong)uVar6;
    } while (-1 < (int)uVar6);
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  while( true ) {
    piVar4[uVar7] = piVar4[uVar7 - 1];
    bVar2 = uVar7 < 2;
    uVar7 = uVar7 - 1;
    if (bVar2) break;
LAB_0023834f:
    if (piVar4[uVar7 - 1] <= iVar5) goto LAB_0023836c;
  }
  uVar7 = 0;
LAB_0023836c:
  piVar4[(int)uVar7] = iVar5;
  return;
}

Assistant:

void Gia_ObjComputeTruth6CisSupport_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPushOrder( vSupp, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId0p(p, pObj), vSupp );
    Gia_ObjComputeTruth6CisSupport_rec( p, Gia_ObjFaninId1p(p, pObj), vSupp );
}